

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O2

Result __thiscall
wabt::BinaryReaderLogging::OnTryTableExpr
          (BinaryReaderLogging *this,Type sig_type,CatchClauseVector *catches)

{
  pointer pCVar1;
  Enum EVar2;
  ulong uVar3;
  CatchClause *catch_;
  pointer pCVar4;
  char *pcVar5;
  Stream *pSVar6;
  int iVar7;
  
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnTryTableExpr(sig: ");
  LogType(this,sig_type);
  uVar3 = ((long)(catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>)
                ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  iVar7 = (int)uVar3;
  Stream::Writef(this->stream_,", n: %u, catches: [",uVar3 & 0xffffffff);
  pCVar4 = (catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    iVar7 = iVar7 + -1;
    if (pCVar4 == pCVar1) {
      Stream::Writef(this->stream_,"])\n");
      EVar2 = (*this->reader_->_vptr_BinaryReaderDelegate[0x85])(this->reader_,sig_type,catches);
      return (Result)EVar2;
    }
    if (CatchAllRef < pCVar4->kind) goto LAB_001357bf;
    switch(pCVar4->kind) {
    case Catch:
      pSVar6 = this->stream_;
      pcVar5 = "catch %u %u";
      break;
    case CatchRef:
      pSVar6 = this->stream_;
      pcVar5 = "catch_ref %u %u";
      break;
    case CatchAll:
      pSVar6 = this->stream_;
      pcVar5 = "catch_all %u";
      goto LAB_001357a2;
    case CatchAllRef:
      pSVar6 = this->stream_;
      pcVar5 = "catch_all_ref %u";
LAB_001357a2:
      Stream::Writef(pSVar6,pcVar5,(ulong)pCVar4->depth);
      goto LAB_001357bf;
    }
    Stream::Writef(pSVar6,pcVar5,(ulong)pCVar4->tag);
LAB_001357bf:
    if (iVar7 != 0) {
      Stream::Writef(this->stream_,", ");
    }
    pCVar4 = pCVar4 + 1;
  } while( true );
}

Assistant:

Result BinaryReaderLogging::OnTryTableExpr(Type sig_type,
                                           const CatchClauseVector& catches) {
  LOGF("OnTryTableExpr(sig: ");
  LogType(sig_type);
  Index count = catches.size();
  LOGF_NOINDENT(", n: %" PRIindex ", catches: [", count);

  for (auto& catch_ : catches) {
    auto tag = catch_.tag;
    auto depth = catch_.depth;
    switch (catch_.kind) {
      case CatchKind::Catch:
        LOGF_NOINDENT("catch %" PRIindex " %" PRIindex, tag, depth);
        break;
      case CatchKind::CatchRef:
        LOGF_NOINDENT("catch_ref %" PRIindex " %" PRIindex, tag, depth);
        break;
      case CatchKind::CatchAll:
        LOGF_NOINDENT("catch_all %" PRIindex, depth);
        break;
      case CatchKind::CatchAllRef:
        LOGF_NOINDENT("catch_all_ref %" PRIindex, depth);
        break;
    }
    if (--count != 0) {
      LOGF_NOINDENT(", ");
    }
  }
  LOGF_NOINDENT("])\n");

  return reader_->OnTryTableExpr(sig_type, catches);
}